

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmakeRegenTest.cpp
# Opt level: O0

void __thiscall
TestRegenerateCmakeTargetLinkLibraries_Private::Run
          (TestRegenerateCmakeTargetLinkLibraries_Private *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  __type _Var1;
  runtime_error *this_00;
  string *this_01;
  __type v;
  ostringstream oss;
  string expectedOutput;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  privateDeps;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  publicDeps;
  bool isHeaderOnly;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffce8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcf0;
  allocator *paVar2;
  undefined1 isHeaderOnly_00;
  allocator_type *in_stack_fffffffffffffd10;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffd18;
  string *psVar3;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffd20;
  string *o;
  iterator pbVar4;
  string local_2b0 [39];
  undefined1 local_289;
  ostringstream local_288 [383];
  allocator local_109;
  string local_108 [32];
  undefined1 local_e8 [23];
  allocator local_d1 [9];
  string local_c8 [32];
  string local_a8 [32];
  string *local_88;
  undefined8 local_80;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined1 local_9;
  
  local_9 = 0;
  local_28 = 0;
  uStack_20 = 0;
  local_38 = 0;
  uStack_30 = 0;
  local_48 = 0;
  uStack_40 = 0;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x156ccf);
  local_e8[2] = 1;
  local_d1._1_8_ = local_c8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c8,"ComponentZ",local_d1);
  psVar3 = local_a8;
  local_d1._1_8_ = psVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(psVar3,"ComponentY",(allocator *)(local_e8 + 3));
  local_e8[2] = 0;
  local_88 = local_c8;
  local_80 = 2;
  pbVar4 = (iterator)local_e8;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x156d91);
  __l._M_len = (size_type)psVar3;
  __l._M_array = pbVar4;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(in_stack_fffffffffffffd20,__l,in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x156dca);
  psVar3 = local_c8;
  this_01 = (string *)&local_88;
  do {
    this_01 = this_01 + -0x20;
    std::__cxx11::string::~string(this_01);
  } while (this_01 != psVar3);
  o = this_01;
  std::allocator<char>::~allocator((allocator<char> *)(local_e8 + 3));
  std::allocator<char>::~allocator((allocator<char> *)local_d1);
  paVar2 = &local_109;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_108,
             "target_link_libraries(${PROJECT_NAME}\n  PRIVATE\n    ComponentY\n    ComponentZ\n)\n\n"
             ,paVar2);
  isHeaderOnly_00 = (undefined1)((ulong)paVar2 >> 0x38);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  std::__cxx11::ostringstream::ostringstream(local_288);
  RegenerateCmakeTargetLinkLibraries
            ((ostream *)o,
             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)psVar3,
             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)this_01,(bool)isHeaderOnly_00);
  std::__cxx11::ostringstream::str();
  _Var1 = std::operator==(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
  std::__cxx11::string::~string(local_2b0);
  local_289 = _Var1;
  if (!_Var1) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Assertion failed: oss.str() == expectedOutput");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::ostringstream::~ostringstream(local_288);
  std::__cxx11::string::~string(local_108);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x1570ce);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x1570db);
  return;
}

Assistant:

TEST(RegenerateCmakeTargetLinkLibraries_Private) {
  bool isHeaderOnly = false;
  const std::set<std::string> publicDeps{};
  const std::set<std::string> privateDeps{
    "ComponentZ",
    "ComponentY"
  };

  const std::string expectedOutput(
      "target_link_libraries(${PROJECT_NAME}\n"
      "  PRIVATE\n"
      "    ComponentY\n"
      "    ComponentZ\n"
      ")\n"
      "\n");

  std::ostringstream oss;
  RegenerateCmakeTargetLinkLibraries(oss, publicDeps, privateDeps, isHeaderOnly);

  ASSERT(oss.str() == expectedOutput);
}